

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to4_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  uint _w;
  long lVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  void *local_a8;
  void *local_a0;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar6 = outch + 3;
  if (-1 < outch) {
    iVar6 = outch;
  }
  Mat::create(kernel_tm,_w * 4,inch,iVar6 >> 2,4,(Allocator *)0x0);
  if (3 < outch) {
    pvVar2 = kernel_tm->data;
    sVar3 = kernel_tm->cstep;
    sVar4 = kernel_tm->elemsize;
    lVar5 = (long)local_78.w * local_78.elemsize;
    lVar9 = local_78.elemsize * local_78.cstep;
    local_a0 = (void *)(lVar9 * 3 + (long)local_78.data);
    lVar1 = lVar9 * 4;
    local_a8 = (void *)((long)local_78.data + lVar9 * 2);
    pvVar10 = (void *)(lVar9 + (long)local_78.data);
    pvVar12 = local_78.data;
    uVar14 = 0;
    do {
      if (0 < inch) {
        pvVar15 = (void *)((uVar14 >> 2) * sVar3 * sVar4 + (long)pvVar2);
        uVar16 = 0;
        pvVar7 = pvVar12;
        pvVar8 = pvVar10;
        pvVar13 = local_a0;
        pvVar17 = local_a8;
        do {
          if (0 < (int)_w) {
            lVar9 = 0;
            lVar11 = 0;
            do {
              *(undefined4 *)((long)pvVar15 + lVar11 * 4) = *(undefined4 *)((long)pvVar7 + lVar11);
              *(undefined4 *)((long)pvVar15 + lVar11 * 4 + 4) =
                   *(undefined4 *)((long)pvVar8 + lVar11);
              *(undefined4 *)((long)pvVar15 + lVar11 * 4 + 8) =
                   *(undefined4 *)((long)pvVar17 + lVar11);
              *(undefined4 *)((long)pvVar15 + lVar11 * 4 + 0xc) =
                   *(undefined4 *)((long)pvVar13 + lVar11);
              lVar11 = lVar11 + 4;
              lVar9 = lVar9 + -0x10;
            } while ((ulong)_w << 2 != lVar11);
            pvVar15 = (void *)((long)pvVar15 - lVar9);
          }
          uVar16 = uVar16 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar5);
          pvVar17 = (void *)((long)pvVar17 + lVar5);
          pvVar8 = (void *)((long)pvVar8 + lVar5);
          pvVar7 = (void *)((long)pvVar7 + lVar5);
        } while (uVar16 != (uint)inch);
      }
      uVar16 = uVar14 + 7;
      local_a0 = (void *)((long)local_a0 + lVar1);
      local_a8 = (void *)((long)local_a8 + lVar1);
      pvVar10 = (void *)((long)pvVar10 + lVar1);
      pvVar12 = (void *)((long)pvVar12 + lVar1);
      uVar14 = uVar14 + 4;
    } while (uVar16 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to4_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4b-4a-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(4 * maxk, inch, outch / 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00 += 4;
            }
        }
    }
}